

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_InsertRange_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_InsertRange_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it;
  const_iterator f;
  const_iterator l;
  bool bVar1;
  reference ppVar2;
  pair<std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>,_bool> pVar3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  const_iterator set_end;
  const_iterator set_begin;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  const_iterator end;
  const_iterator begin;
  set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
  set_input;
  value_type input [4];
  TypeParam ht_source;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff888;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> l_00;
  allocator_type *in_stack_fffffffffffff8a0;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> f_00;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 uVar4;
  int in_stack_fffffffffffff8ac;
  int line;
  const_iterator *in_stack_fffffffffffff8b0;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *__i;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  Type type;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff8c0;
  _Base_ptr this_02;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8d0;
  reference in_stack_fffffffffffff8f0;
  value_type in_stack_fffffffffffff8f8;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff900;
  value_type in_stack_fffffffffffff908;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff910;
  undefined8 in_stack_fffffffffffff918;
  pointer in_stack_fffffffffffff920;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff928;
  undefined8 in_stack_fffffffffffff930;
  undefined8 in_stack_fffffffffffff938;
  undefined7 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff947;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff948;
  AssertionResult local_558 [2];
  size_type local_538;
  undefined4 local_52c;
  AssertionResult local_528;
  _Base_ptr local_518;
  _Base_ptr local_510;
  _Base_ptr local_508;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_500;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_4f8;
  string local_4f0 [48];
  value_type local_4c0;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_4b8;
  value_type local_498;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_490;
  value_type local_470;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_468;
  value_type local_448;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_440;
  value_type local_420;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_418;
  value_type local_3f8;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_3f0;
  undefined1 local_3c9;
  AssertionResult local_3c8 [2];
  size_type local_3a8;
  undefined4 local_39c;
  AssertionResult local_398;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_388;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_380;
  _Base_ptr local_378;
  _Base_ptr p_Stack_370;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_368;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_360;
  _Base_ptr local_358;
  _Base_ptr p_Stack_350;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_348;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_340;
  _Base_ptr local_338;
  _Base_ptr p_Stack_330;
  const_iterator *pcStack_320;
  undefined8 uStack_310;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_308;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_300;
  _Base_ptr local_2f8;
  _Base_ptr p_Stack_2f0;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  value_type local_2d8;
  _Base_ptr local_2d0;
  undefined1 local_2c8;
  value_type local_2c0;
  _Base_ptr local_2b8;
  undefined1 local_2b0;
  value_type local_2a8;
  _Base_ptr local_2a0;
  undefined1 local_298;
  value_type local_290;
  _Base_ptr local_288;
  undefined1 local_280;
  value_type local_278;
  _Base_ptr local_270;
  undefined1 local_268;
  value_type local_260;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_228;
  pair<const_int,_int> local_208;
  value_type local_200;
  value_type local_1f8;
  value_type local_1f0;
  value_type local_1b8;
  value_type local_188;
  value_type local_158;
  value_type local_128;
  value_type local_f8;
  value_type local_c4;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0;
  Hasher local_a0;
  Hasher local_94 [12];
  
  Hasher::Hasher(local_94,0);
  Hasher::Hasher(&local_a0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff8c0,CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8)
             ,(hasher *)in_stack_fffffffffffff8b0,
             (key_equal *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             in_stack_fffffffffffff8a0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b0);
  local_c4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff888,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff908);
  local_f8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff888,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff908);
  local_128 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff908);
  local_158 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff908);
  local_188 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff908);
  local_1b8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff908);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff8d0);
  ppVar2 = google::
           dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*(&local_228);
  local_208 = *ppVar2;
  local_200 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  local_1f8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  local_1f0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  std::
  set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
  ::set((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
         *)0xe42ac6);
  local_260 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  pVar3 = std::
          set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
          ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)in_stack_fffffffffffff8b0,
                   (value_type *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
  local_270 = (_Base_ptr)pVar3.first._M_node;
  local_268 = pVar3.second;
  local_278 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  pVar3 = std::
          set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
          ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)in_stack_fffffffffffff8b0,
                   (value_type *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
  local_288 = (_Base_ptr)pVar3.first._M_node;
  local_280 = pVar3.second;
  local_290 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  pVar3 = std::
          set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
          ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)in_stack_fffffffffffff8b0,
                   (value_type *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
  local_2a0 = (_Base_ptr)pVar3.first._M_node;
  local_298 = pVar3.second;
  local_2a8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  pVar3 = std::
          set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
          ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)in_stack_fffffffffffff8b0,
                   (value_type *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
  local_2b8 = (_Base_ptr)pVar3.first._M_node;
  local_2b0 = pVar3.second;
  local_2c0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  pVar3 = std::
          set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
          ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)in_stack_fffffffffffff8b0,
                   (value_type *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
  local_2d0 = (_Base_ptr)pVar3.first._M_node;
  local_2c8 = pVar3.second;
  local_2d8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff888,0);
  pVar3 = std::
          set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
          ::insert((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)in_stack_fffffffffffff8b0,
                   (value_type *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
  local_2e8 = (_Base_ptr)pVar3.first._M_node;
  local_2e0 = pVar3.second;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff8d0);
  it.super_iterator.pos._0_4_ = in_stack_fffffffffffff8a8;
  it.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_310;
  it.super_iterator.pos._4_4_ = in_stack_fffffffffffff8ac;
  it.super_iterator.end = (pointer)in_stack_fffffffffffff8b0;
  it.parent_._0_4_ = in_stack_fffffffffffff8b8;
  it.parent_._4_4_ = in_stack_fffffffffffff8bc;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(pcStack_320,it);
  local_338 = local_2f8;
  p_Stack_330 = p_Stack_2f0;
  local_348 = local_308;
  pBStack_340 = pBStack_300;
  std::
  advance<google::BaseHashtableInterface<google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator,int>
            (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac);
  local_358 = local_2f8;
  p_Stack_350 = p_Stack_2f0;
  local_368 = local_308;
  pBStack_360 = pBStack_300;
  local_378 = local_338;
  p_Stack_370 = p_Stack_330;
  local_388 = local_348;
  pBStack_380 = pBStack_340;
  type = (Type)((ulong)local_338 >> 0x20);
  uVar4 = SUB84(local_348,0);
  line = (int)((ulong)local_348 >> 0x20);
  f.super_const_iterator.pos = (pointer)in_stack_fffffffffffff918;
  f.super_const_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff910;
  f.super_const_iterator.end = in_stack_fffffffffffff920;
  f.parent_ = in_stack_fffffffffffff928;
  l.super_const_iterator.pos = (pointer)in_stack_fffffffffffff938;
  l.super_const_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffff930;
  l.super_const_iterator.end._0_7_ = in_stack_fffffffffffff940;
  l.super_const_iterator.end._7_1_ = in_stack_fffffffffffff947;
  l.parent_ = in_stack_fffffffffffff948;
  __i = pBStack_340;
  this_02 = p_Stack_330;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::
  insert<google::BaseHashtableInterface<google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator>
            (in_stack_fffffffffffff900,f,l);
  local_39c = 3;
  local_3a8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe42e7b);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,uVar4),(char *)p_Stack_2f0,&local_2f8->_M_color,
             (unsigned_long *)pBStack_300);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
  this_00 = local_308;
  this_01 = pBStack_300;
  l_00._M_node = local_2f8;
  f_00._M_node = p_Stack_2f0;
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xe42f4e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)__i,line,(char *)p_Stack_2f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff910,(Message *)in_stack_fffffffffffff908);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pBStack_300);
    testing::Message::~Message((Message *)0xe42fb1);
    this_00 = local_308;
    this_01 = pBStack_300;
    l_00._M_node = local_2f8;
    f_00._M_node = p_Stack_2f0;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe43022);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff8d0);
  ppVar2 = google::
           dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*(&local_3f0);
  local_3f8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(this_00,0);
  bVar1 = std::operator==(ppVar2,&local_3f8);
  local_3c9 = true;
  if (!bVar1) {
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::begin(in_stack_fffffffffffff8d0);
    ppVar2 = google::
             dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator*(&local_418);
    local_420 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(this_00,0);
    bVar1 = std::operator==(ppVar2,&local_420);
    local_3c9 = true;
    if (!bVar1) {
      google::
      BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::begin(in_stack_fffffffffffff8d0);
      ppVar2 = google::
               dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator*(&local_440);
      local_448 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(this_00,0);
      bVar1 = std::operator==(ppVar2,&local_448);
      local_3c9 = true;
      if (!bVar1) {
        google::
        BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ::begin(in_stack_fffffffffffff8d0);
        in_stack_fffffffffffff910 =
             (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)google::
                dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::operator*(&local_468);
        local_470 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ::UniqueObject(this_00,0);
        bVar1 = std::operator==((pair<const_int,_int> *)in_stack_fffffffffffff910,&local_470);
        local_3c9 = true;
        if (!bVar1) {
          google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::begin(in_stack_fffffffffffff8d0);
          in_stack_fffffffffffff900 =
               (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)google::
                  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  ::operator*(&local_490);
          in_stack_fffffffffffff908 =
               HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(this_00,0);
          local_498 = in_stack_fffffffffffff908;
          bVar1 = std::operator==((pair<const_int,_int> *)in_stack_fffffffffffff900,&local_498);
          local_3c9 = true;
          if (!bVar1) {
            google::
            BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::begin(in_stack_fffffffffffff8d0);
            in_stack_fffffffffffff8f0 =
                 google::
                 dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 ::operator*(&local_4b8);
            in_stack_fffffffffffff8f8 =
                 HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(this_00,0);
            local_4c0 = in_stack_fffffffffffff8f8;
            local_3c9 = std::operator==(in_stack_fffffffffffff8f0,&local_4c0);
          }
        }
      }
    }
  }
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)this_00,(type *)0xe43346);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffff908,(char *)in_stack_fffffffffffff900,
               (char *)in_stack_fffffffffffff8f8,(char *)in_stack_fffffffffffff8f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)__i,line,(char *)f_00._M_node);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff910,(Message *)in_stack_fffffffffffff908);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_4f0);
    testing::Message::~Message((Message *)0xe4341b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe434b2);
  std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator(&local_4f8);
  std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator(&local_500);
  local_508 = (_Base_ptr)
              std::
              set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
              ::begin((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)this_00);
  local_500._M_node = local_508;
  local_4f8._M_node = local_508;
  std::advance<std::_Rb_tree_const_iterator<std::pair<int_const,int>>,int>
            ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)__i,line);
  local_510 = local_4f8._M_node;
  local_518 = local_500._M_node;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::insert<std::_Rb_tree_const_iterator<std::pair<int_const,int>>>(this_01,f_00,l_00);
  local_52c = 6;
  local_538 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe43576);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,uVar4),(char *)f_00._M_node,&(l_00._M_node)->_M_color,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_528);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xe435fd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)__i,line,(char *)f_00._M_node);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff910,(Message *)in_stack_fffffffffffff908);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xe4365a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe436cb);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::insert<std::pair<int_const,int>const*>
            (this_01,(pair<const_int,_int> *)this_00,(pair<const_int,_int> *)0xe436ec);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xe4370a);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,uVar4),(char *)f_00._M_node,&(l_00._M_node)->_M_color,
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_558);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xe43791);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)__i,line,(char *)f_00._M_node);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff910,(Message *)in_stack_fffffffffffff908);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xe437ee);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe43859);
  std::
  set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~set((set<std::pair<const_int,_int>,_std::less<std::pair<const_int,_int>_>,_std::allocator<std::pair<const_int,_int>_>_>
          *)0xe43866);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xe43873);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, InsertRange) {
  // We just test the ints here, to make the placement-new easier.
  TypeParam ht_source;
  ht_source.insert(this->UniqueObject(10));
  ht_source.insert(this->UniqueObject(100));
  ht_source.insert(this->UniqueObject(1000));
  ht_source.insert(this->UniqueObject(10000));
  ht_source.insert(this->UniqueObject(100000));
  ht_source.insert(this->UniqueObject(1000000));

  const typename TypeParam::value_type input[] = {
      // This is a copy of the first element in ht_source.
      *ht_source.begin(), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};

  set<typename TypeParam::value_type> set_input;
  set_input.insert(this->UniqueObject(1111111));
  set_input.insert(this->UniqueObject(111111));
  set_input.insert(this->UniqueObject(11111));
  set_input.insert(this->UniqueObject(1111));
  set_input.insert(this->UniqueObject(111));
  set_input.insert(this->UniqueObject(11));

  // Insert from ht_source, an iterator of the same type as us.
  typename TypeParam::const_iterator begin = ht_source.begin();
  typename TypeParam::const_iterator end = begin;
  std::advance(end, 3);
  this->ht_.insert(begin, end);  // insert 3 elements from ht_source
  EXPECT_EQ(3u, this->ht_.size());
  EXPECT_TRUE(*this->ht_.begin() == this->UniqueObject(10) ||
              *this->ht_.begin() == this->UniqueObject(100) ||
              *this->ht_.begin() == this->UniqueObject(1000) ||
              *this->ht_.begin() == this->UniqueObject(10000) ||
              *this->ht_.begin() == this->UniqueObject(100000) ||
              *this->ht_.begin() == this->UniqueObject(1000000));

  // And insert from set_input, a separate, non-random-access iterator.
  typename set<typename TypeParam::value_type>::const_iterator set_begin;
  typename set<typename TypeParam::value_type>::const_iterator set_end;
  set_begin = set_input.begin();
  set_end = set_begin;
  std::advance(set_end, 3);
  this->ht_.insert(set_begin, set_end);
  EXPECT_EQ(6u, this->ht_.size());

  // Insert from input as well, a separate, random-access iterator.
  // The first element of input overlaps with an existing element
  // of ht_, so this should only up the size by 2.
  this->ht_.insert(&input[0], &input[3]);
  EXPECT_EQ(8u, this->ht_.size());
}